

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O1

adt_error_t adt_bytearray_realloc(adt_bytearray_t *self,uint32_t u32NewLen)

{
  uint8_t *__src;
  adt_error_t aVar1;
  uint8_t *__dest;
  ulong __n;
  
  __dest = (uint8_t *)malloc((ulong)u32NewLen);
  if (__dest == (uint8_t *)0x0) {
    aVar1 = '\x02';
  }
  else {
    __src = self->pData;
    if (__src != (uint8_t *)0x0) {
      __n = (ulong)self->u32CurLen;
      if (u32NewLen <= self->u32CurLen) {
        __n = (ulong)u32NewLen;
      }
      memcpy(__dest,__src,__n);
      free(__src);
    }
    self->pData = __dest;
    self->u32AllocLen = u32NewLen;
    aVar1 = '\0';
  }
  return aVar1;
}

Assistant:

static adt_error_t adt_bytearray_realloc(adt_bytearray_t *self, uint32_t u32NewLen) {
   if (self != 0) {
      uint8_t *pNewData = (uint8_t*) malloc(u32NewLen);
      if(pNewData != 0){
         if(self->pData != 0) {
            uint32_t u32CopyLen = (u32NewLen < self->u32CurLen)? u32NewLen : self->u32CurLen;
            memcpy(pNewData, self->pData, u32CopyLen);
            free(self->pData);
         }
         self->pData = pNewData;
         self->u32AllocLen = u32NewLen;
      }
      else {
         return ADT_MEM_ERROR;
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}